

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O3

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefHashTableOf<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher> **objToLoad,
               int param_2,bool toAdopt,XSerializeEngine *serEng)

{
  bool bVar1;
  int iVar2;
  MemoryManager *pMVar3;
  RefHashTableOf<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher> *this;
  XMLStringPool *pXVar4;
  undefined4 extraout_var;
  XercesGroupInfo *valueToAdopt;
  _func_int **__nbytes;
  void *__buf;
  ulong uVar5;
  uint id;
  XMLSize_t itemNumber;
  XMLSize_t hashModulus;
  uint local_44;
  XMLSize_t local_40;
  XMLSize_t local_38;
  
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    XSerializeEngine::readSize(serEng,&local_38);
    this = *objToLoad;
    if (this == (RefHashTableOf<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher> *)0x0) {
      pMVar3 = XSerializeEngine::getMemoryManager(serEng);
      this = (RefHashTableOf<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher> *)
             XMemory::operator_new(0x38,pMVar3);
      pMVar3 = XSerializeEngine::getMemoryManager(serEng);
      this->fMemoryManager = pMVar3;
      this->fAdoptedElems = toAdopt;
      this->fBucketList = (RefHashTableBucketElem<xercesc_4_0::XercesGroupInfo> **)0x0;
      this->fHashModulus = local_38;
      this->fInitialModulus = local_38;
      this->fCount = 0;
      RefHashTableOf<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>::initialize
                (this,local_38);
      *objToLoad = this;
    }
    XSerializeEngine::registerObject(serEng,this);
    local_40 = 0;
    XSerializeEngine::readSize(serEng,&local_40);
    if (local_40 != 0) {
      uVar5 = 0;
      do {
        XSerializeEngine::operator>>(serEng,&local_44);
        pXVar4 = XSerializeEngine::getStringPool(serEng);
        __nbytes = (pXVar4->super_XSerializable)._vptr_XSerializable;
        iVar2 = (*__nbytes[10])(pXVar4,(ulong)local_44);
        valueToAdopt = (XercesGroupInfo *)
                       XSerializeEngine::read(serEng,0x439af0,__buf,(size_t)__nbytes);
        RefHashTableOf<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>::put
                  (*objToLoad,(void *)CONCAT44(extraout_var,iVar2),valueToAdopt);
        uVar5 = uVar5 + 1;
      } while (uVar5 < local_40);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefHashTableOf<XercesGroupInfo>** objToLoad
                                   , int
                                   , bool                              toAdopt
                                   , XSerializeEngine&                 serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        XMLSize_t hashModulus;
        serEng.readSize (hashModulus);

        if (!*objToLoad)
        {
            *objToLoad = new (serEng.getMemoryManager())
                             RefHashTableOf<XercesGroupInfo>(
                                                             hashModulus
                                                           , toAdopt
                                                           , serEng.getMemoryManager()
                                                           );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t itemNumber = 0;
        serEng.readSize (itemNumber);

        for (XMLSize_t itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            unsigned int id;
            serEng>>id;

            XMLCh* key = (XMLCh*) serEng.getStringPool()->getValueForId(id);

            XercesGroupInfo*  data;
            serEng>>data;

            (*objToLoad)->put((void*)key, data);
        }
    }
}